

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseCharDataInternal(xmlParserCtxtPtr ctxt,int partial)

{
  int *piVar1;
  byte *pbVar2;
  byte bVar3;
  uchar uVar4;
  xmlParserInputPtr pxVar5;
  xmlChar *pxVar6;
  int iVar7;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  int iVar11;
  
  pxVar5 = ctxt->input;
  iVar8 = pxVar5->line;
  iVar11 = pxVar5->col;
  if (((pxVar5->flags & 0x40) == 0) && ((long)pxVar5->end - (long)pxVar5->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  pbVar10 = ctxt->input->cur;
  do {
    while( true ) {
      while (bVar3 = *pbVar10, bVar3 == 10) {
        pxVar5 = ctxt->input;
        iVar7 = pxVar5->line;
        pbVar9 = pbVar10;
        do {
          iVar7 = iVar7 + 1;
          pxVar5->line = iVar7;
          pxVar5->col = 1;
          pbVar10 = pbVar9 + 1;
          pbVar2 = pbVar9 + 1;
          pbVar9 = pbVar10;
        } while (*pbVar2 == 10);
      }
      if (bVar3 != 0x20) break;
      pbVar10 = pbVar10 + 1;
      piVar1 = &ctxt->input->col;
      *piVar1 = *piVar1 + 1;
    }
    if (bVar3 == 0x3c) {
      pxVar6 = ctxt->input->cur;
      iVar8 = (int)pbVar10 - (int)pxVar6;
      if (iVar8 < 1) {
        return;
      }
      ctxt->input->cur = pbVar10;
      xmlCharacters(ctxt,pxVar6,iVar8);
      return;
    }
    pxVar5 = ctxt->input;
    iVar7 = pxVar5->col;
    while( true ) {
      while( true ) {
        uVar4 = ""[*pbVar10];
        pbVar9 = pbVar10;
        while (uVar4 != '\0') {
          iVar7 = iVar7 + 1;
          pbVar10 = pbVar9 + 1;
          pbVar9 = pbVar9 + 1;
          uVar4 = ""[*pbVar10];
        }
        pxVar5->col = iVar7;
        if (*pbVar9 != 0x5d) break;
        pbVar10 = pbVar9 + 1;
        if ((pbVar9[1] == 0x5d) && (pbVar9[2] == 0x3e)) {
          xmlFatalErr(ctxt,XML_ERR_MISPLACED_CDATA_END,(char *)0x0);
          ctxt->input->cur = pbVar10;
          return;
        }
        if ((partial != 0) && ((long)pxVar5->end - (long)pbVar9 < 2)) goto LAB_001357c3;
        iVar7 = iVar7 + 1;
        pxVar5->col = iVar7;
      }
      if (*pbVar9 != 10) break;
      iVar7 = pxVar5->line;
      do {
        iVar7 = iVar7 + 1;
        pxVar5->line = iVar7;
        pxVar5->col = 1;
        pbVar10 = pbVar9 + 1;
        pbVar9 = pbVar9 + 1;
      } while (*pbVar10 == 10);
      iVar7 = 1;
      pbVar10 = pbVar9;
    }
LAB_001357c3:
    pxVar6 = pxVar5->cur;
    iVar7 = (int)pbVar9 - (int)pxVar6;
    if (0 < iVar7) {
      pxVar5->cur = pbVar9;
      xmlCharacters(ctxt,pxVar6,iVar7);
      iVar8 = ctxt->input->line;
      iVar11 = ctxt->input->col;
    }
    pxVar5 = ctxt->input;
    pxVar5->cur = pbVar9;
    bVar3 = *pbVar9;
    if ((bVar3 == 0xd) && (pbVar9[1] == 10)) {
      pxVar5->cur = pbVar9 + 1;
      pxVar5->line = pxVar5->line + 1;
      pbVar10 = pbVar9 + 2;
      pxVar5->col = 1;
    }
    else {
      if (bVar3 == 0x26) {
        return;
      }
      if (bVar3 == 0x3c) {
        return;
      }
      if (((partial != 0) && (bVar3 == 0x5d)) && ((long)pxVar5->end - (long)pbVar9 < 2)) {
        return;
      }
      if ((pxVar5->flags & 0x40) == 0) {
        xmlParserShrink(ctxt);
      }
      pxVar5 = ctxt->input;
      if (((pxVar5->flags & 0x40) == 0) && ((long)pxVar5->end - (long)pxVar5->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      pbVar10 = ctxt->input->cur;
    }
    if (1 < (byte)(*pbVar10 - 9) && (char)*pbVar10 < ' ') {
      pxVar5 = ctxt->input;
      pxVar5->line = iVar8;
      pxVar5->col = iVar11;
      xmlParseCharDataComplex(ctxt,partial);
      return;
    }
  } while( true );
}

Assistant:

static void
xmlParseCharDataInternal(xmlParserCtxtPtr ctxt, int partial) {
    const xmlChar *in;
    int nbchar = 0;
    int line = ctxt->input->line;
    int col = ctxt->input->col;
    int ccol;

    GROW;
    /*
     * Accelerated common case where input don't need to be
     * modified before passing it to the handler.
     */
    in = ctxt->input->cur;
    do {
get_more_space:
        while (*in == 0x20) { in++; ctxt->input->col++; }
        if (*in == 0xA) {
            do {
                ctxt->input->line++; ctxt->input->col = 1;
                in++;
            } while (*in == 0xA);
            goto get_more_space;
        }
        if (*in == '<') {
            nbchar = in - ctxt->input->cur;
            if (nbchar > 0) {
                const xmlChar *tmp = ctxt->input->cur;
                ctxt->input->cur = in;

                xmlCharacters(ctxt, tmp, nbchar);
            }
            return;
        }

get_more:
        ccol = ctxt->input->col;
        while (test_char_data[*in]) {
            in++;
            ccol++;
        }
        ctxt->input->col = ccol;
        if (*in == 0xA) {
            do {
                ctxt->input->line++; ctxt->input->col = 1;
                in++;
            } while (*in == 0xA);
            goto get_more;
        }
        if (*in == ']') {
            if ((in[1] == ']') && (in[2] == '>')) {
                xmlFatalErr(ctxt, XML_ERR_MISPLACED_CDATA_END, NULL);
                ctxt->input->cur = in + 1;
                return;
            }
            if ((!partial) || (ctxt->input->end - in >= 2)) {
                in++;
                ctxt->input->col++;
                goto get_more;
            }
        }
        nbchar = in - ctxt->input->cur;
        if (nbchar > 0) {
            const xmlChar *tmp = ctxt->input->cur;
            ctxt->input->cur = in;

            xmlCharacters(ctxt, tmp, nbchar);

            line = ctxt->input->line;
            col = ctxt->input->col;
        }
        ctxt->input->cur = in;
        if (*in == 0xD) {
            in++;
            if (*in == 0xA) {
                ctxt->input->cur = in;
                in++;
                ctxt->input->line++; ctxt->input->col = 1;
                continue; /* while */
            }
            in--;
        }
        if (*in == '<') {
            return;
        }
        if (*in == '&') {
            return;
        }
        if ((partial) && (*in == ']') && (ctxt->input->end - in < 2)) {
            return;
        }
        SHRINK;
        GROW;
        in = ctxt->input->cur;
    } while (((*in >= 0x20) && (*in <= 0x7F)) ||
             (*in == 0x09) || (*in == 0x0a));
    ctxt->input->line = line;
    ctxt->input->col = col;
    xmlParseCharDataComplex(ctxt, partial);
}